

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_variableEqualById_Test::~Equality_variableEqualById_Test
          (Equality_variableEqualById_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, variableEqualById)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    v1->setId("lefisjeij");
    v2->setId("lefisjeij");

    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}